

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareWinSweepLeafTfo(Odc_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *__s;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  
  pAVar3 = p->pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar6 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar6) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar6;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar6;
  }
  iVar2 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pVVar4 = p->vLeaves;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        Abc_NtkDontCareWinSweepLeafTfo_rec
                  ((Abc_Obj_t *)pVVar4->pArray[lVar5],
                   (*(uint *)&p->pNode->field_0x14 >> 0xc) + p->nLevels,p->pNode);
        lVar5 = lVar5 + 1;
        pVVar4 = p->vLeaves;
      } while (lVar5 < pVVar4->nSize);
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkDontCareWinSweepLeafTfo( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NtkDontCareWinSweepLeafTfo_rec( pObj, p->pNode->Level + p->nLevels, p->pNode );
}